

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interval.hpp
# Opt level: O0

size_t __thiscall
std::hash<duckdb::interval_t>::operator()(hash<duckdb::interval_t> *this,interval_t *val)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  interval_t *in_RSI;
  int64_t micros;
  int64_t days;
  int64_t months;
  hash<long> local_2b;
  hash<int> local_2a;
  hash<int> local_29;
  long local_28;
  long local_20;
  long local_18 [3];
  
  duckdb::interval_t::Normalize(in_RSI,local_18,&local_20,&local_28);
  iVar1 = duckdb::UnsafeNumericCast<int,long,void>(local_20);
  sVar2 = hash<int>::operator()(&local_29,iVar1);
  iVar1 = duckdb::UnsafeNumericCast<int,long,void>(local_18[0]);
  sVar3 = hash<int>::operator()(&local_2a,iVar1);
  sVar4 = hash<long>::operator()(&local_2b,local_28);
  return sVar2 ^ sVar3 ^ sVar4;
}

Assistant:

size_t operator()(const duckdb::interval_t &val) const {
		int64_t months, days, micros;
		val.Normalize(months, days, micros);
		using std::hash;

		return hash<int32_t> {}(duckdb::UnsafeNumericCast<int32_t>(days)) ^
		       hash<int32_t> {}(duckdb::UnsafeNumericCast<int32_t>(months)) ^ hash<int64_t> {}(micros);
	}